

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<char_const&>::
GetDescriberImpl<testing::internal::MatcherBase<char_const&>::ValuePolicy<testing::internal::EqMatcher<char>,true>>
          (MatcherBase<const_char_&> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<const_char_&>_*,_const_EqMatcher<char>_*>_>
  *ppMVar1;
  MatcherBase<const_char_&> *local_28;
  tuple<const_testing::internal::MatcherBase<const_char_&>_*,_const_testing::internal::EqMatcher<char>_*>
  local_20;
  MatcherBase<const_char_&> *local_10;
  MatcherBase<const_char_&> *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<const_char_&>::ValuePolicy<testing::internal::EqMatcher<char>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<char_const&>const*,testing::internal::EqMatcher<char>const*>
            ((MatcherBase<const_char_&> **)&local_20,(EqMatcher<char> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<char_const&>const*,testing::internal::EqMatcher<char>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }